

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseAssign.h
# Opt level: O3

void Eigen::internal::
     assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseMatrix<double,0,int>const>>
               (SparseMatrix<double,_0,_int> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
               *src)

{
  LhsNested pSVar1;
  RhsNested pSVar2;
  Index IVar3;
  Scalar *pSVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  StorageIndex *pSVar7;
  long lVar8;
  Scalar *pSVar9;
  StorageIndex *pSVar10;
  bool bVar11;
  Index IVar12;
  StorageIndex *pSVar13;
  Index IVar14;
  Index IVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  StorageIndex SVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int iVar28;
  Scalar SVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  Scalar v;
  Scalar local_b8;
  SparseMatrix<double,_0,_int> local_78;
  
  pSVar1 = src->m_lhs;
  pSVar2 = src->m_rhs;
  IVar3 = pSVar2->m_outerSize;
  if ((src->
      super_CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>
      ).
      super_SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
      .m_isRValue == true) {
    SparseMatrix<double,_0,_int>::resize(dst,pSVar2->m_innerSize,IVar3);
    (dst->m_data).m_size = 0;
    memset(dst->m_outerIndex,0,dst->m_outerSize * 4 + 4);
    if (dst->m_innerNonZeros != (StorageIndex *)0x0) {
      memset(dst->m_innerNonZeros,0,dst->m_outerSize << 2);
    }
    lVar22 = src->m_rhs->m_outerSize;
    lVar24 = src->m_rhs->m_innerSize;
    if (lVar22 < lVar24) {
      lVar22 = lVar24;
    }
    CompressedStorage<double,_int>::reserve(&dst->m_data,lVar22 * 2);
    if (0 < IVar3) {
      lVar22 = 0;
      do {
        dst->m_outerIndex[lVar22 + 1] = dst->m_outerIndex[lVar22];
        lVar24 = (long)pSVar1->m_outerIndex[lVar22];
        if (pSVar1->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar20 = (long)pSVar1->m_outerIndex[lVar22 + 1];
        }
        else {
          lVar20 = pSVar1->m_innerNonZeros[lVar22] + lVar24;
        }
        pSVar4 = (pSVar1->m_data).m_values;
        pSVar5 = (pSVar1->m_data).m_indices;
        pSVar6 = (pSVar2->m_data).m_values;
        pSVar7 = (pSVar2->m_data).m_indices;
        lVar25 = (long)pSVar2->m_outerIndex[lVar22];
        if (pSVar2->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar21 = (long)pSVar2->m_outerIndex[lVar22 + 1];
        }
        else {
          lVar21 = pSVar2->m_innerNonZeros[lVar22] + lVar25;
        }
        if (lVar24 < lVar20) {
          iVar28 = pSVar5[lVar24];
          goto joined_r0x00142c76;
        }
joined_r0x00142c82:
        if (lVar25 < lVar21) {
          iVar28 = pSVar7[lVar25];
          do {
            local_b8 = pSVar6[lVar25] + 0.0;
            lVar25 = lVar25 + 1;
LAB_00142cca:
            while( true ) {
              if (iVar28 < 0) goto LAB_00142d91;
              iVar32 = dst->m_outerIndex[lVar22 + 1];
              dst->m_outerIndex[lVar22 + 1] = iVar32 + 1;
              lVar8 = (dst->m_data).m_size;
              CompressedStorage<double,_int>::resize(&dst->m_data,lVar8 + 1,1.0);
              pSVar9 = (dst->m_data).m_values;
              pSVar9[lVar8] = 0.0;
              (dst->m_data).m_indices[lVar8] = iVar28;
              pSVar9[iVar32] = local_b8;
              if (lVar20 <= lVar24) goto joined_r0x00142c82;
              iVar28 = pSVar5[lVar24];
joined_r0x00142c76:
              if (lVar25 < lVar21) break;
LAB_00142d3e:
              local_b8 = pSVar4[lVar24] + 0.0;
              lVar24 = lVar24 + 1;
            }
            iVar32 = pSVar7[lVar25];
            if (iVar28 == iVar32) {
              local_b8 = pSVar4[lVar24] + pSVar6[lVar25];
              lVar24 = lVar24 + 1;
              lVar25 = lVar25 + 1;
              goto LAB_00142cca;
            }
            if (iVar28 < iVar32) goto LAB_00142d3e;
            bVar11 = iVar32 < iVar28;
            iVar28 = iVar32;
          } while (bVar11);
        }
LAB_00142d91:
        lVar22 = lVar22 + 1;
      } while (lVar22 != IVar3);
    }
    auVar18 = _DAT_0019a840;
    auVar17 = _DAT_0019a830;
    auVar16 = _DAT_0019a820;
    if ((dst->m_innerNonZeros == (StorageIndex *)0x0) && (lVar22 = dst->m_outerSize, -1 < lVar22)) {
      SVar19 = (StorageIndex)(dst->m_data).m_size;
      pSVar10 = dst->m_outerIndex;
      lVar24 = lVar22;
      do {
        if (pSVar10[lVar24] != 0) goto LAB_00142ddf;
        bVar11 = 0 < lVar24;
        lVar24 = lVar24 + -1;
      } while (bVar11);
      lVar24 = -1;
LAB_00142ddf:
      lVar20 = lVar22 - lVar24;
      if (lVar20 != 0 && lVar24 <= lVar22) {
        lVar22 = lVar20 + -1;
        auVar27._8_4_ = (int)lVar22;
        auVar27._0_8_ = lVar22;
        auVar27._12_4_ = (int)((ulong)lVar22 >> 0x20);
        uVar23 = 0;
        auVar27 = auVar27 ^ _DAT_0019a840;
        do {
          auVar29._8_4_ = (int)uVar23;
          auVar29._0_8_ = uVar23;
          auVar29._12_4_ = (int)(uVar23 >> 0x20);
          auVar31 = (auVar29 | auVar17) ^ auVar18;
          iVar28 = auVar27._4_4_;
          if ((bool)(~(auVar31._4_4_ == iVar28 && auVar27._0_4_ < auVar31._0_4_ ||
                      iVar28 < auVar31._4_4_) & 1)) {
            pSVar10[lVar24 + uVar23 + 1] = SVar19;
          }
          if ((auVar31._12_4_ != auVar27._12_4_ || auVar31._8_4_ <= auVar27._8_4_) &&
              auVar31._12_4_ <= auVar27._12_4_) {
            pSVar10[lVar24 + uVar23 + 2] = SVar19;
          }
          auVar31 = (auVar29 | auVar16) ^ auVar18;
          iVar32 = auVar31._4_4_;
          if (iVar32 <= iVar28 && (iVar32 != iVar28 || auVar31._0_4_ <= auVar27._0_4_)) {
            pSVar10[lVar24 + uVar23 + 3] = SVar19;
            pSVar10[lVar24 + uVar23 + 4] = SVar19;
          }
          uVar23 = uVar23 + 4;
        } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar23);
      }
    }
  }
  else {
    local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
    local_78.m_outerSize = 0;
    local_78.m_innerSize = 0;
    local_78.m_outerIndex = (StorageIndex *)0x0;
    local_78.m_innerNonZeros = (StorageIndex *)0x0;
    local_78.m_data.m_values = (Scalar *)0x0;
    local_78.m_data.m_indices = (StorageIndex *)0x0;
    local_78.m_data.m_size = 0;
    local_78.m_data.m_allocatedSize = 0;
    SparseMatrix<double,_0,_int>::resize(&local_78,pSVar2->m_innerSize,IVar3);
    lVar22 = src->m_rhs->m_outerSize;
    lVar24 = src->m_rhs->m_innerSize;
    if (lVar22 < lVar24) {
      lVar22 = lVar24;
    }
    CompressedStorage<double,_int>::reserve(&local_78.m_data,lVar22 * 2);
    if (0 < IVar3) {
      lVar22 = 0;
      do {
        local_78.m_outerIndex[lVar22 + 1] = local_78.m_outerIndex[lVar22];
        lVar24 = (long)pSVar1->m_outerIndex[lVar22];
        if (pSVar1->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar20 = (long)pSVar1->m_outerIndex[lVar22 + 1];
        }
        else {
          lVar20 = pSVar1->m_innerNonZeros[lVar22] + lVar24;
        }
        pSVar4 = (pSVar1->m_data).m_values;
        pSVar5 = (pSVar1->m_data).m_indices;
        pSVar6 = (pSVar2->m_data).m_values;
        pSVar7 = (pSVar2->m_data).m_indices;
        lVar25 = (long)pSVar2->m_outerIndex[lVar22];
        if (pSVar2->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar21 = (long)pSVar2->m_outerIndex[lVar22 + 1];
        }
        else {
          lVar21 = pSVar2->m_innerNonZeros[lVar22] + lVar25;
        }
        if (lVar24 < lVar20) {
          iVar28 = pSVar5[lVar24];
          goto joined_r0x00142fc5;
        }
joined_r0x00142fd1:
        if (lVar25 < lVar21) {
          iVar28 = pSVar7[lVar25];
          do {
            SVar26 = pSVar6[lVar25] + 0.0;
            lVar25 = lVar25 + 1;
LAB_00143017:
            while( true ) {
              IVar12 = local_78.m_data.m_size;
              if (iVar28 < 0) goto LAB_001430e2;
              iVar32 = local_78.m_outerIndex[lVar22 + 1];
              local_78.m_outerIndex[lVar22 + 1] = iVar32 + 1;
              CompressedStorage<double,_int>::resize
                        (&local_78.m_data,local_78.m_data.m_size + 1,1.0);
              local_78.m_data.m_values[IVar12] = 0.0;
              local_78.m_data.m_indices[IVar12] = iVar28;
              local_78.m_data.m_values[iVar32] = SVar26;
              if (lVar20 <= lVar24) goto joined_r0x00142fd1;
              iVar28 = pSVar5[lVar24];
joined_r0x00142fc5:
              if (lVar25 < lVar21) break;
LAB_0014309b:
              SVar26 = pSVar4[lVar24] + 0.0;
              lVar24 = lVar24 + 1;
            }
            iVar32 = pSVar7[lVar25];
            if (iVar28 == iVar32) {
              SVar26 = pSVar4[lVar24] + pSVar6[lVar25];
              lVar24 = lVar24 + 1;
              lVar25 = lVar25 + 1;
              goto LAB_00143017;
            }
            if (iVar28 < iVar32) goto LAB_0014309b;
            bVar11 = iVar32 < iVar28;
            iVar28 = iVar32;
          } while (bVar11);
        }
LAB_001430e2:
        lVar22 = lVar22 + 1;
      } while (lVar22 != IVar3);
    }
    auVar18 = _DAT_0019a840;
    auVar17 = _DAT_0019a830;
    auVar16 = _DAT_0019a820;
    if ((local_78.m_innerNonZeros == (StorageIndex *)0x0) &&
       (lVar22 = local_78.m_outerSize, -1 < local_78.m_outerSize)) {
      do {
        if (local_78.m_outerIndex[lVar22] != 0) goto LAB_001431e9;
        bVar11 = 0 < lVar22;
        lVar22 = lVar22 + -1;
      } while (bVar11);
      lVar22 = -1;
LAB_001431e9:
      lVar24 = local_78.m_outerSize - lVar22;
      if (lVar24 != 0 && lVar22 <= local_78.m_outerSize) {
        lVar20 = lVar24 + -1;
        auVar31._8_4_ = (int)lVar20;
        auVar31._0_8_ = lVar20;
        auVar31._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar23 = 0;
        auVar31 = auVar31 ^ _DAT_0019a840;
        do {
          auVar30._8_4_ = (int)uVar23;
          auVar30._0_8_ = uVar23;
          auVar30._12_4_ = (int)(uVar23 >> 0x20);
          auVar27 = (auVar30 | auVar17) ^ auVar18;
          iVar28 = auVar31._4_4_;
          SVar19 = (StorageIndex)local_78.m_data.m_size;
          if ((bool)(~(auVar27._4_4_ == iVar28 && auVar31._0_4_ < auVar27._0_4_ ||
                      iVar28 < auVar27._4_4_) & 1)) {
            local_78.m_outerIndex[lVar22 + uVar23 + 1] = SVar19;
          }
          if ((auVar27._12_4_ != auVar31._12_4_ || auVar27._8_4_ <= auVar31._8_4_) &&
              auVar27._12_4_ <= auVar31._12_4_) {
            local_78.m_outerIndex[lVar22 + uVar23 + 2] = SVar19;
          }
          auVar30 = (auVar30 | auVar16) ^ auVar18;
          iVar32 = auVar30._4_4_;
          if (iVar32 <= iVar28 && (iVar32 != iVar28 || auVar30._0_4_ <= auVar31._0_4_)) {
            local_78.m_outerIndex[lVar22 + uVar23 + 3] = SVar19;
            local_78.m_outerIndex[lVar22 + uVar23 + 4] = SVar19;
          }
          uVar23 = uVar23 + 4;
        } while ((lVar24 + 3U & 0xfffffffffffffffc) != uVar23);
      }
    }
    local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)true;
    pSVar10 = dst->m_outerIndex;
    dst->m_outerIndex = local_78.m_outerIndex;
    IVar3 = dst->m_outerSize;
    IVar12 = dst->m_innerSize;
    dst->m_innerSize = local_78.m_innerSize;
    dst->m_outerSize = local_78.m_outerSize;
    pSVar13 = dst->m_innerNonZeros;
    pSVar4 = (dst->m_data).m_values;
    dst->m_innerNonZeros = local_78.m_innerNonZeros;
    pSVar5 = (dst->m_data).m_indices;
    (dst->m_data).m_values = local_78.m_data.m_values;
    (dst->m_data).m_indices = local_78.m_data.m_indices;
    IVar14 = (dst->m_data).m_size;
    IVar15 = (dst->m_data).m_allocatedSize;
    (dst->m_data).m_size = local_78.m_data.m_size;
    (dst->m_data).m_allocatedSize = local_78.m_data.m_allocatedSize;
    local_78.m_outerSize = IVar3;
    local_78.m_innerSize = IVar12;
    local_78.m_outerIndex = pSVar10;
    local_78.m_innerNonZeros = pSVar13;
    local_78.m_data.m_values = pSVar4;
    local_78.m_data.m_indices = pSVar5;
    local_78.m_data.m_size = IVar14;
    local_78.m_data.m_allocatedSize = IVar15;
    free(pSVar10);
    free(local_78.m_innerNonZeros);
    CompressedStorage<double,_int>::~CompressedStorage(&local_78.m_data);
  }
  return;
}

Assistant:

void assign_sparse_to_sparse(DstXprType &dst, const SrcXprType &src)
{
  typedef typename DstXprType::Scalar Scalar;
  typedef internal::evaluator<DstXprType> DstEvaluatorType;
  typedef internal::evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  const bool transpose = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit);
  const Index outerEvaluationSize = (SrcEvaluatorType::Flags&RowMajorBit) ? src.rows() : src.cols();
  if ((!transpose) && src.isRValue())
  {
    // eval without temporary
    dst.resize(src.rows(), src.cols());
    dst.setZero();
    dst.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      dst.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        dst.insertBackByOuterInner(j,it.index()) = v;
      }
    }
    dst.finalize();
  }
  else
  {
    // eval through a temporary
    eigen_assert(( ((internal::traits<DstXprType>::SupportedAccessPatterns & OuterRandomAccessPattern)==OuterRandomAccessPattern) ||
              (!((DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit)))) &&
              "the transpose operation is supposed to be handled in SparseMatrix::operator=");

    enum { Flip = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit) };

    
    DstXprType temp(src.rows(), src.cols());

    temp.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      temp.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        temp.insertBackByOuterInner(Flip?it.index():j,Flip?j:it.index()) = v;
      }
    }
    temp.finalize();

    dst = temp.markAsRValue();
  }
}